

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O2

QSize __thiscall QSizeF::toSize(QSizeF *this)

{
  bool bVar1;
  QSize QVar2;
  double dVar3;
  
  dVar3 = (double)((ulong)this->wd & 0x8000000000000000 | 0x3fe0000000000000) + this->wd;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.wd.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  dVar3 = (double)((ulong)this->ht & 0x8000000000000000 | 0x3fe0000000000000) + this->ht;
  bVar1 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar2.ht.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3);
  return QVar2;
}

Assistant:

constexpr inline QSize QSizeF::toSize() const noexcept
{
    return QSize(QtPrivate::qSaturateRound(wd), QtPrivate::qSaturateRound(ht));
}